

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yprc_inout(lys_ypr_ctx *pctx,lysc_node_action_inout *inout,ly_bool *flag)

{
  uint16_t *puVar1;
  ly_out *out;
  lysc_must *plVar2;
  ly_stmt substmt;
  uint uVar3;
  lysc_ext_instance *plVar4;
  ulong uVar5;
  lysc_ext_instance *plVar6;
  lysc_node *node;
  long lVar7;
  
  if (inout->child != (lysc_node *)0x0) {
    if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
      out = (pctx->field_0).field_0.out;
      *flag = '\x01';
      ly_print_(out," {\n");
    }
    uVar5 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar5 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    lVar7 = 0;
    ly_print_((pctx->field_0).field_0.out,"\n%*s%s {\n",uVar5,"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    yprc_extension_instances(pctx,substmt,'\0',(inout->field_0).node.exts,(ly_bool *)0x0);
    plVar6 = (lysc_ext_instance *)0x0;
    while( true ) {
      plVar2 = inout->musts;
      if (plVar2 == (lysc_must *)0x0) {
        plVar4 = (lysc_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar2[-1].exts;
      }
      if (plVar4 <= plVar6) break;
      yprc_must(pctx,(lysc_must *)((long)&plVar2->cond + lVar7),(ly_bool *)0x0);
      plVar6 = (lysc_ext_instance *)((long)&plVar6->def + 1);
      lVar7 = lVar7 + 0x38;
    }
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x1000000000) ==
        (undefined1  [24])0x0) {
      for (node = inout->child; node != (lysc_node *)0x0; node = node->next) {
        yprc_node(pctx,node);
      }
    }
    uVar3 = *(int *)((long)&pctx->field_0 + 8) - 1;
    (pctx->field_0).field_0.level = (uint16_t)uVar3;
    uVar3 = (uVar3 & 0xffff) * 2;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
        (undefined1  [24])0x0) {
      uVar3 = 0;
    }
    ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar3,"");
    return;
  }
  return;
}

Assistant:

static void
yprc_inout(struct lys_ypr_ctx *pctx, const struct lysc_node_action_inout *inout, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_node *data;

    if (!inout->child) {
        /* input/output is empty */
        return;
    }
    ypr_open(pctx->out, flag);

    ly_print_(pctx->out, "\n%*s%s {\n", INDENT, inout->name);
    LEVEL++;

    yprc_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprc_must(pctx, &inout->musts[u], NULL);
    }

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        LY_LIST_FOR(inout->child, data) {
            yprc_node(pctx, data);
        }
    }

    LEVEL--;
    ypr_close(pctx, 1);
}